

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3NameFromToken(sqlite3 *db,Token *pName)

{
  u64 in_RSI;
  char *in_RDI;
  char *zName;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = sqlite3DbStrNDup((sqlite3 *)zName,in_RDI,in_RSI);
    sqlite3Dequote(local_18);
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE char *sqlite3NameFromToken(sqlite3 *db, const Token *pName){
  char *zName;
  if( pName ){
    zName = sqlite3DbStrNDup(db, (const char*)pName->z, pName->n);
    sqlite3Dequote(zName);
  }else{
    zName = 0;
  }
  return zName;
}